

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

void fprefx(obj *otmp)

{
  ushort uVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  char *pcVar7;
  int tmp;
  int iVar8;
  ulong xtime;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar1 = otmp->otyp;
  if (uVar1 < 0x116) {
    if (uVar1 == 0x10d) {
      if (((youmonst.data)->mflags1 & 0x20020000) == 0x20000000) {
        pcVar10 = "That tripe ration was surprisingly good!";
        goto LAB_00191c5b;
      }
      if (u.umonnum == u.umonster) {
        if (urace.malenum == 0x4a) {
          pcVar10 = "Tastes great! Less filling!";
          if (u.uprops[0x24].extrinsic != 0) {
            pcVar10 = "Mmm, tripe... not bad!";
          }
          if (u.uprops[0x23].intrinsic == 0) {
            pcVar10 = "Mmm, tripe... not bad!";
          }
          goto LAB_00191c5b;
        }
      }
      else if (((youmonst.data)->mflags2 & 0x80) != 0) {
        pcVar10 = "Mmm, tripe... not bad!";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          bVar2 = dmgtype(youmonst.data,0x24);
          pcVar10 = "Mmm, tripe... not bad!";
          if (bVar2 == '\0') {
            pcVar10 = "Tastes great! Less filling!";
          }
        }
        goto LAB_00191c5b;
      }
      pline("Yak - dog food!");
      if (urole.malenum == 0x15d) {
        pline("At least it\'s not prison food.");
      }
      more_experienced(1,1,0);
      newexplevel();
      uVar4 = mt_random();
      if ((uVar4 & 1) == 0) {
        return;
      }
      auVar13._8_2_ = urole.guardnum;
      auVar13._10_2_ = urole.neminum;
      auVar13._12_2_ = urole.questarti;
      auVar13._14_2_ = urole.allow;
      auVar13._0_8_ =
           CONCAT62(urole._210_6_,urole.malenum) & 0xffffffff0000ffff |
           (ulong)(ushort)urace.malenum << 0x10;
      auVar13 = pshuflw(auVar13,auVar13,0x50);
      auVar14._0_2_ = -(ushort)(auVar13._0_2_ == 0);
      auVar14._2_2_ = -(ushort)(auVar13._2_2_ == 0x15b);
      auVar14._4_2_ = -(ushort)(auVar13._4_2_ == 0);
      auVar14._6_2_ = -(ushort)(auVar13._6_2_ == 0x4a);
      auVar14._8_2_ = -(ushort)(auVar13._4_2_ == 0);
      auVar14._10_2_ = -(ushort)(auVar13._6_2_ == 0xe8);
      auVar14._12_2_ = -(ushort)(auVar13._0_2_ == 0);
      auVar14._14_2_ = -(ushort)(auVar13._2_2_ == 0x15d);
      uVar6 = movmskps(0x35c930,auVar14);
      if ((char)uVar6 != '\0') {
        return;
      }
      lVar9 = (long)victual.reqtime;
      uVar4 = mt_random();
      xtime = SUB168(ZEXT416(uVar4) % SEXT816(lVar9),0) + 0xe;
LAB_001918c7:
      bVar2 = '\0';
LAB_00191ab0:
      make_vomiting(xtime,bVar2);
      return;
    }
    if ((uVar1 == 0x10f) && (400 < moves - otmp->age)) {
      pline("Ugh.  Rotten egg.");
      if ((urole.malenum == 0x15d) && (uVar4 = mt_random(), u.ulevel < (int)(uVar4 & 7))) {
        pcVar10 = "You feel a slight stomach ache.";
        goto LAB_00191c5b;
      }
      uVar4 = u.uprops[0x2f].intrinsic;
      iVar8 = 10;
      iVar12 = -10;
      do {
        uVar5 = mt_random();
        iVar8 = iVar8 + (uVar5 & 3);
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
      xtime = (ulong)(iVar8 + uVar4);
      bVar2 = '\x01';
      goto LAB_00191ab0;
    }
  }
  else {
    switch(uVar1) {
    case 0x116:
    case 0x118:
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        pcVar10 = "Core dumped.";
      }
      else {
        uVar4 = mt_random();
        if (uVar4 % 100 < 0x4b) {
          pcVar10 = "Segmentation fault -- core dumped.";
        }
        else if (uVar4 % 100 < 99) {
          pcVar10 = "Bus error -- core dumped.";
        }
        else {
          pcVar10 = "Yo\' mama -- core dumped.";
        }
      }
LAB_00191c5b:
      pline(pcVar10);
      return;
    case 0x117:
    case 0x119:
    case 0x11a:
    case 0x11b:
    case 0x11c:
      break;
    case 0x11d:
      if (((youmonst.data)->mflags2 & 2) != 0) {
        lVar9 = (long)victual.reqtime;
        uVar4 = mt_random();
        xtime = SUB168(ZEXT416(uVar4) % SEXT816(lVar9),0) + 5;
        goto LAB_001918c7;
      }
      break;
    case 0x11e:
      if (((otmp->field_0x4a & 1) == 0) && (current_fruit == otmp->spe)) {
        pcVar10 = "yummy";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar10 = "primo";
          }
          else {
            bVar2 = dmgtype(youmonst.data,0x24);
            pcVar10 = "yummy";
            if (bVar2 == '\0') {
              pcVar10 = "primo";
            }
          }
        }
        pcVar7 = singular(otmp,xname);
        pcVar11 = "My, that was a %s %s!";
        goto LAB_00191aec;
      }
      break;
    default:
      if (uVar1 == 0x126) {
        if (200 < u.uhunger) {
          if (700 < (uint)u.uhunger) {
            return;
          }
          pcVar10 = body_part(0x12);
          pline("That satiated your %s!",pcVar10);
          return;
        }
        pcVar10 = "That food really hit the spot!";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar10 = "Oh wow, like, superior, man!";
          }
          else {
            bVar2 = dmgtype(youmonst.data,0x24);
            pcVar10 = "That food really hit the spot!";
            if (bVar2 == '\0') {
              pcVar10 = "Oh wow, like, superior, man!";
            }
          }
        }
        goto LAB_00191c5b;
      }
    }
  }
  pcVar10 = singular(otmp,xname);
  if ((otmp->field_0x4a & 1) == 0) {
    uVar4 = (ushort)otmp->otyp - 0x125;
    if ((uVar4 < 4) && (uVar4 != 1)) {
      pcVar7 = "bland.";
    }
    else {
      pcVar7 = "delicious!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum != u.umonster) {
          cVar3 = dmgtype(youmonst.data,0x24);
          pcVar11 = "gnarly!";
          pcVar7 = "delicious!";
          goto LAB_00191ade;
        }
        pcVar7 = "gnarly!";
      }
    }
  }
  else {
    pcVar7 = "terrible!";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar7 = "grody!";
      }
      else {
        cVar3 = dmgtype(youmonst.data,0x24);
        pcVar11 = "grody!";
        pcVar7 = "terrible!";
LAB_00191ade:
        if (cVar3 == '\0') {
          pcVar7 = pcVar11;
        }
      }
    }
  }
  pcVar11 = "This %s is %s";
LAB_00191aec:
  pline(pcVar11,pcVar10,pcVar7);
  return;
}

Assistant:

static void fprefx(struct obj *otmp)
{
	switch(otmp->otyp) {
	    case FOOD_RATION:
		if (u.uhunger <= 200)
		    pline(Hallucination ? "Oh wow, like, superior, man!" :
			  "That food really hit the spot!");
		else if (u.uhunger <= 700) pline("That satiated your %s!",
						body_part(STOMACH));
		break;
	    case TRIPE_RATION:
		if (carnivorous(youmonst.data) && !humanoid(youmonst.data))
		    pline("That tripe ration was surprisingly good!");
		else if (maybe_polyd(is_orc(youmonst.data), Race_if (PM_ORC)))
		    pline(Hallucination ? "Tastes great! Less filling!" :
			  "Mmm, tripe... not bad!");
		else {
		    pline("Yak - dog food!");
		    if (Role_if(PM_CONVICT))
			pline("At least it's not prison food.");
		    more_experienced(1, 1, 0);
		    newexplevel();
		    /* not cannibalism, but we use similar criteria
		       for deciding whether to be sickened by this meal */
		    if (rn2(2) && !CANNIBAL_ALLOWED() && !Role_if(PM_CONVICT))
			make_vomiting((long)rn1(victual.reqtime, 14), FALSE);
		}
		break;
	    case MEATBALL:
	    case MEAT_STICK:
	    case HUGE_CHUNK_OF_MEAT:
	    case MEAT_RING:
		goto give_feedback;
	     /* break; */
	    case CLOVE_OF_GARLIC:
		if (is_undead(youmonst.data)) {
			make_vomiting((long)rn1(victual.reqtime, 5), FALSE);
			break;
		}
		/* Fall through otherwise */
	    default:
		if (otmp->otyp==SLIME_MOLD && !otmp->cursed
			&& otmp->spe == current_fruit)
		    pline("My, that was a %s %s!",
			  Hallucination ? "primo" : "yummy",
			  singular(otmp, xname));
		else
#ifdef UNIX
		if (otmp->otyp == APPLE || otmp->otyp == PEAR) {
		    if (!Hallucination) pline("Core dumped.");
		    else {
/* This is based on an old Usenet joke, a fake a.out manual page */
			int x = rnd(100);
			if (x <= 75)
			    pline("Segmentation fault -- core dumped.");
			else if (x <= 99)
			    pline("Bus error -- core dumped.");
			else pline("Yo' mama -- core dumped.");
		    }
		} else
#endif
		if (otmp->otyp == EGG && stale_egg(otmp)) {
		    pline("Ugh.  Rotten egg.");	/* perhaps others like it */
		    /* prisoners are used to bad food */
		    if (Role_if(PM_CONVICT) && rn2(8) > u.ulevel)
			pline("You feel a slight stomach ache.");
		    else
			make_vomiting(Vomiting + dice(10,4), TRUE);
		} else
 give_feedback:
		    pline("This %s is %s", singular(otmp, xname),
		      otmp->cursed ? (Hallucination ? "grody!" : "terrible!") :
		      (otmp->otyp == CRAM_RATION
		      || otmp->otyp == K_RATION
		      || otmp->otyp == C_RATION)
		      ? "bland." :
		      Hallucination ? "gnarly!" : "delicious!");
		break;
	}
}